

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment_uri.h
# Opt level: O2

HalfRange ktx::parseHalfRange(string_view key,string_view str)

{
  uint uVar1;
  int iVar2;
  size_type __n;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  basic_string_view<char,_std::char_traits<char>_> strBegin;
  string_view str_local;
  string local_98;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  allocator<char> local_50 [32];
  
  str_local._M_str = str._M_str;
  str_local._M_len = str._M_len;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::find(&str_local,',',0);
  if (__n == 0xffffffffffffffff) {
    strBegin._M_str = str_local._M_str;
    strBegin._M_len = str_local._M_len;
    local_60 = (basic_string_view<char,_std::char_traits<char>_>)(ZEXT816(0x15d04a) << 0x40);
    sVar3 = str_local._M_len;
  }
  else {
    strBegin = std::basic_string_view<char,_std::char_traits<char>_>::substr(&str_local,0,__n);
    sVar3 = strBegin._M_len;
    local_60 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&str_local,__n + 1,0xffffffffffffffff);
  }
  sVar5 = local_60._M_len;
  if (sVar3 == 0) {
    uVar4 = 0;
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_98,&strBegin,local_50);
    uVar1 = std::__cxx11::stoi(&local_98,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_98);
    uVar4 = (ulong)uVar1;
  }
  if (sVar5 == 0) {
    uVar6 = 0xffffffff00000000;
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_98,&local_60,local_50);
    iVar2 = std::__cxx11::stoi(&local_98,(size_t *)0x0,10);
    uVar6 = (ulong)(iVar2 + 1) << 0x20;
    std::__cxx11::string::~string((string *)&local_98);
  }
  return (HalfRange)(uVar6 | uVar4);
}

Assistant:

[[nodiscard]] inline SelectorRange::HalfRange parseHalfRange(std::string_view key, std::string_view str) {
    const auto indexComma = str.find(',');
    const auto strBegin = indexComma == std::string_view::npos ? str : str.substr(0, indexComma);
    const auto strEnd = indexComma == std::string_view::npos ? "" : str.substr(indexComma + 1);

    try {
        const auto begin = strBegin.empty() ? 0u : static_cast<uint32_t>(std::stoi(std::string(strBegin)));
        const auto end = strEnd.empty() ? RangeEnd : static_cast<uint32_t>(std::stoi(std::string(strEnd))) + 1u;
        return {begin, end};
    } catch (const std::exception& ex) {
        throw std::invalid_argument(fmt::format("Invalid key-value \"{}={}\": {}", key, str, ex.what()));
    }
}